

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int get_input_event(void)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = getchar();
  if (iVar1 < 0x71) {
    if (iVar1 == 0x61) {
      iVar2 = 3;
    }
    else if (iVar1 == 100) {
      iVar2 = 4;
    }
    else {
      iVar2 = 0;
      if (iVar1 == 0x65) {
        iVar2 = 5;
      }
    }
  }
  else if (iVar1 == 0x71) {
    iVar2 = 6;
  }
  else if (iVar1 == 0x73) {
    iVar2 = 2;
  }
  else if (iVar1 == 0x77) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int get_input_event()
{
	int event = UGUI_EVT_NONE;
	int input = getchar();
	switch (input) {
	case 'a':
		event = UGUI_EVT_LEFT;
		break;
	case 'd':
		event = UGUI_EVT_RIGHT;
		break;
	case 'w':
		event = UGUI_EVT_UP;
		break;
	case 's':
		event = UGUI_EVT_DOWN;
		break;
	case 'e':
		event = UGUI_EVT_SELECT;
		break;
	case 'q':
		event = UGUI_EVT_BACK;
		break;
	}

	return event;
}